

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

parse_return __thiscall
msgpack::v2::detail::
context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::
after_visit_proc(context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
                 *this,bool visit_result,size_t *off)

{
  char *pcVar1;
  parse_return pVar2;
  undefined7 in_register_00000031;
  
  pcVar1 = this->m_current;
  this->m_current = pcVar1 + 1;
  if ((int)CONCAT71(in_register_00000031,visit_result) == 0) {
    *off = (long)(pcVar1 + 1) - (long)this->m_start;
    pVar2 = PARSE_STOP_VISITOR;
  }
  else {
    pVar2 = unpack_stack::consume
                      (&this->m_stack,
                       (parse_helper<msgpack::v2::detail::create_object_visitor> *)this);
    if (pVar2 != PARSE_CONTINUE) {
      *off = (long)this->m_current - (long)this->m_start;
    }
    this->m_cs = 0;
  }
  return pVar2;
}

Assistant:

parse_return after_visit_proc(bool visit_result, std::size_t& off) {
        ++m_current;
        if (!visit_result) {
            off = static_cast<std::size_t>(m_current - m_start);
            return PARSE_STOP_VISITOR;
        }
        parse_return ret = m_stack.consume(holder());
        if (ret != PARSE_CONTINUE) {
            off = static_cast<std::size_t>(m_current - m_start);
        }
        m_cs = MSGPACK_CS_HEADER;
        return ret;
    }